

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

YY_BUFFER_STATE yy_scan_bytes(char *yybytes,int _yybytes_len)

{
  char *base;
  void *pvVar1;
  YY_BUFFER_STATE pyVar2;
  int in_ESI;
  long in_RDI;
  int i;
  yy_size_t n;
  char *buf;
  YY_BUFFER_STATE b;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  
  base = (char *)(long)(in_ESI + 2);
  pvVar1 = yyalloc(0x12c945);
  if (pvVar1 == (void *)0x0) {
    yy_fatal_error((char *)0x12c95e);
  }
  for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
    *(undefined1 *)((long)pvVar1 + (long)iVar3) = *(undefined1 *)(in_RDI + iVar3);
  }
  *(undefined1 *)((long)pvVar1 + (long)(in_ESI + 1)) = 0;
  *(undefined1 *)((long)pvVar1 + (long)in_ESI) = 0;
  pyVar2 = yy_scan_buffer(base,CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  if (pyVar2 == (YY_BUFFER_STATE)0x0) {
    yy_fatal_error((char *)0x12c9e0);
  }
  pyVar2->yy_is_our_buffer = 1;
  return pyVar2;
}

Assistant:

YY_BUFFER_STATE yy_scan_bytes  (const char * yybytes, int  _yybytes_len )
{
	YY_BUFFER_STATE b;
	char *buf;
	yy_size_t n;
	int i;
    
	/* Get memory for full buffer, including space for trailing EOB's. */
	n = (yy_size_t) (_yybytes_len + 2);
	buf = (char *) yyalloc( n  );
	if ( ! buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_bytes()" );

	for ( i = 0; i < _yybytes_len; ++i )
		buf[i] = yybytes[i];

	buf[_yybytes_len] = buf[_yybytes_len+1] = YY_END_OF_BUFFER_CHAR;

	b = yy_scan_buffer( buf, n );
	if ( ! b )
		YY_FATAL_ERROR( "bad buffer in yy_scan_bytes()" );

	/* It's okay to grow etc. this buffer, and we should throw it
	 * away when we're done.
	 */
	b->yy_is_our_buffer = 1;

	return b;
}